

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_true>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  AABBNodeMB4D *node1;
  ulong uVar5;
  ulong uVar6;
  RTCIntersectFunctionN p_Var7;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar8;
  uint uVar9;
  size_t sVar10;
  NodeRef *pNVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  vint4 ai;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vint4 ai_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vint4 ai_3;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_1;
  undefined1 auVar38 [16];
  vint4 bi_3;
  undefined1 auVar39 [16];
  vint4 bi_2;
  undefined1 in_ZMM10 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  RTCIntersectFunctionNArguments local_17e0;
  Geometry *local_17b0;
  undefined8 local_17a8;
  RTCIntersectArguments *local_17a0;
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined1 local_1728 [16];
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  undefined1 local_1708 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar20 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar14 = vpcmpeqd_avx(auVar20,(undefined1  [16])valid_i->field_0);
    auVar18 = ZEXT816(0) << 0x40;
    auVar20 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar18,5);
    auVar15 = auVar14 & auVar20;
    if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar15[0xf] < '\0')
    {
      auVar22 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      local_1798 = vandps_avx(auVar20,auVar14);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar24);
      auVar36._8_4_ = 0x219392ef;
      auVar36._0_8_ = 0x219392ef219392ef;
      auVar36._12_4_ = 0x219392ef;
      auVar20 = vcmpps_avx(auVar20,auVar36,1);
      auVar14 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar36,auVar20);
      auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar24);
      auVar20 = vcmpps_avx(auVar20,auVar36,1);
      auVar15 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar36,auVar20);
      auVar19 = vrcpps_avx(auVar14);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = &DAT_3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_fma(auVar14,auVar19,auVar28);
      auVar25 = vrcpps_avx(auVar15);
      auVar20 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar18);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar20,local_1798);
      auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar24);
      auVar20 = vcmpps_avx(auVar20,auVar36,1);
      auVar14 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar36,auVar20);
      auVar24 = vfnmadd213ps_fma(auVar15,auVar25,auVar28);
      auVar20 = *(undefined1 (*) [16])ray;
      auVar15 = vrcpps_avx(auVar14);
      auVar28 = vfnmadd213ps_fma(auVar14,auVar15,auVar28);
      auVar14 = *(undefined1 (*) [16])(ray + 0x10);
      local_1708 = vfmadd132ps_fma(auVar28,auVar15,auVar15);
      auVar15 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar18);
      auVar18 = vfmadd132ps_fma(auVar26,auVar19,auVar19);
      auVar41 = ZEXT1664(auVar18);
      auVar19._8_4_ = 0xff800000;
      auVar19._0_8_ = 0xff800000ff800000;
      auVar19._12_4_ = 0xff800000;
      auVar15 = vblendvps_avx(auVar19,auVar15,local_1798);
      auVar40 = ZEXT1664(auVar15);
      auVar16 = ZEXT1664(CONCAT412(local_1798._12_4_ ^ auVar22._12_4_,
                                   CONCAT48(local_1798._8_4_ ^ auVar22._8_4_,
                                            CONCAT44(local_1798._4_4_ ^ auVar22._4_4_,
                                                     local_1798._0_4_ ^ auVar22._0_4_))));
      auVar15 = vfmadd132ps_fma(auVar24,auVar25,auVar25);
      auVar42 = ZEXT1664(auVar15);
      pNVar11 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar8 = &stack_near[2].field_0;
      stack_near[1].field_0 = local_16f8;
      local_1718 = auVar18._0_4_ * -auVar20._0_4_;
      fStack_1714 = auVar18._4_4_ * -auVar20._4_4_;
      fStack_1710 = auVar18._8_4_ * -auVar20._8_4_;
      fStack_170c = auVar18._12_4_ * -auVar20._12_4_;
      local_1728._0_4_ = local_1708._0_4_ * -auVar14._0_4_;
      local_1728._4_4_ = local_1708._4_4_ * -auVar14._4_4_;
      local_1728._8_4_ = local_1708._8_4_ * -auVar14._8_4_;
      local_1728._12_4_ = local_1708._12_4_ * -auVar14._12_4_;
      auVar21 = ZEXT1664(local_1728);
      local_1738 = auVar15._0_4_ * -*(float *)(ray + 0x20);
      fStack_1734 = auVar15._4_4_ * -*(float *)(ray + 0x24);
      fStack_1730 = auVar15._8_4_ * -*(float *)(ray + 0x28);
      fStack_172c = auVar15._12_4_ * -*(float *)(ray + 0x2c);
      local_1758 = mm_lookupmask_ps._0_16_;
      do {
        paVar8 = paVar8 + -1;
        sVar10 = pNVar11[-1].ptr;
        pNVar11 = pNVar11 + -1;
        bVar13 = true;
        if (sVar10 != 0xfffffffffffffff8) {
          auVar14 = auVar16._0_16_;
          aVar17 = *paVar8;
          local_1788 = auVar40._0_16_;
          auVar20 = vcmpps_avx((undefined1  [16])aVar17,local_1788,1);
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') {
LAB_00551de8:
            uVar9 = (uint)sVar10;
            local_1768 = auVar41._0_16_;
            local_1778 = auVar42._0_16_;
            if ((sVar10 & 8) == 0) goto code_r0x00551df2;
            if (sVar10 == 0xfffffffffffffff8) goto LAB_00551fcf;
            auVar20 = vcmpps_avx(local_1788,(undefined1  [16])aVar17,6);
            if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar20[0xf] < '\0') {
              uVar6 = (ulong)(uVar9 & 0xf);
              auVar20 = vpcmpeqd_avx(auVar21._0_16_,auVar21._0_16_);
              auVar15 = auVar14;
              if (uVar6 != 8) {
                local_1748 = auVar14 ^ auVar20;
                uVar5 = 1;
                do {
                  local_17e0.geomID = *(uint *)(((sVar10 & 0xfffffffffffffff0) - 8) + uVar5 * 8);
                  local_17b0 = (context->scene->geometries).items[local_17e0.geomID].ptr;
                  uVar9 = local_17b0->mask;
                  auVar20._4_4_ = uVar9;
                  auVar20._0_4_ = uVar9;
                  auVar20._8_4_ = uVar9;
                  auVar20._12_4_ = uVar9;
                  auVar20 = vpand_avx(auVar20,*(undefined1 (*) [16])(ray + 0x90));
                  auVar15 = vpcmpeqd_avx(auVar20,(undefined1  [16])0x0);
                  auVar18 = local_1748 & ~auVar15;
                  auVar20 = local_1758;
                  auVar22 = local_1748;
                  if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar18[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar15,local_1748);
                    local_17e0.primID = *(uint *)(((sVar10 & 0xfffffffffffffff0) - 4) + uVar5 * 8);
                    local_17e0.valid = (int *)&mask;
                    local_17e0.geometryUserPtr = local_17b0->userPtr;
                    local_17e0.context = context->user;
                    local_17e0.N = 4;
                    local_17a8 = 0;
                    local_17a0 = context->args;
                    p_Var7 = local_17a0->intersect;
                    if (p_Var7 == (RTCIntersectFunctionN)0x0) {
                      p_Var7 = (RTCIntersectFunctionN)
                               local_17b0[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17e0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var7)(&local_17e0);
                    auVar20 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0,1)
                    ;
                    auVar41 = ZEXT1664(local_1768);
                    auVar42 = ZEXT1664(local_1778);
                    auVar40 = ZEXT1664(local_1788);
                    auVar22 = local_1748;
                  }
                  local_1748 = vandnps_avx(auVar20,auVar22);
                  auVar22 = auVar22 & ~auVar20;
                } while (((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar22[0xf] < '\0') &&
                        (bVar13 = uVar5 < uVar6 - 8, uVar5 = uVar5 + 1, bVar13));
                auVar20 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                auVar15._0_4_ = local_1748._0_4_ ^ auVar20._0_4_;
                auVar15._4_4_ = local_1748._4_4_ ^ auVar20._4_4_;
                auVar15._8_4_ = local_1748._8_4_ ^ auVar20._8_4_;
                auVar15._12_4_ = local_1748._12_4_ ^ auVar20._12_4_;
              }
              bVar13 = true;
              auVar21 = ZEXT1664(auVar20);
              auVar14 = vpor_avx(auVar14,auVar15);
              auVar20 = auVar20 & ~auVar14;
              auVar16 = ZEXT1664(auVar14);
              if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar20[0xf] < '\0') {
                auVar18._8_4_ = 0xff800000;
                auVar18._0_8_ = 0xff800000ff800000;
                auVar18._12_4_ = 0xff800000;
                auVar20 = vblendvps_avx(auVar40._0_16_,auVar18,auVar14);
                auVar40 = ZEXT1664(auVar20);
                bVar13 = false;
              }
              goto LAB_00551fd4;
            }
          }
LAB_00551fcc:
          bVar13 = false;
LAB_00551fcf:
          auVar16 = ZEXT1664(auVar14);
        }
LAB_00551fd4:
      } while (!bVar13);
      auVar20 = vandps_avx(auVar16._0_16_,local_1798);
      auVar14._8_4_ = 0xff800000;
      auVar14._0_8_ = 0xff800000ff800000;
      auVar14._12_4_ = 0xff800000;
      auVar20 = vmaskmovps_avx(auVar20,auVar14);
      *(undefined1 (*) [16])(ray + 0x80) = auVar20;
    }
  }
  return;
code_r0x00551df2:
  uVar5 = sVar10 & 0xfffffffffffffff0;
  auVar16 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  uVar6 = 0;
  sVar10 = 8;
  do {
    sVar2 = *(size_t *)(uVar5 + uVar6 * 8);
    if (sVar2 != 8) {
      uVar1 = *(undefined4 *)(uVar5 + 0x80 + uVar6 * 4);
      auVar25._4_4_ = uVar1;
      auVar25._0_4_ = uVar1;
      auVar25._8_4_ = uVar1;
      auVar25._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar5 + 0x20 + uVar6 * 4);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      auVar20 = *(undefined1 (*) [16])(ray + 0x70);
      auVar15 = vfmadd231ps_fma(auVar22,auVar20,auVar25);
      uVar1 = *(undefined4 *)(uVar5 + 0xa0 + uVar6 * 4);
      auVar29._4_4_ = uVar1;
      auVar29._0_4_ = uVar1;
      auVar29._8_4_ = uVar1;
      auVar29._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar5 + 0x40 + uVar6 * 4);
      auVar26._4_4_ = uVar1;
      auVar26._0_4_ = uVar1;
      auVar26._8_4_ = uVar1;
      auVar26._12_4_ = uVar1;
      auVar18 = vfmadd231ps_fma(auVar26,auVar20,auVar29);
      uVar1 = *(undefined4 *)(uVar5 + 0xc0 + uVar6 * 4);
      auVar32._4_4_ = uVar1;
      auVar32._0_4_ = uVar1;
      auVar32._8_4_ = uVar1;
      auVar32._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar5 + 0x60 + uVar6 * 4);
      auVar30._4_4_ = uVar1;
      auVar30._0_4_ = uVar1;
      auVar30._8_4_ = uVar1;
      auVar30._12_4_ = uVar1;
      auVar25 = vfmadd231ps_fma(auVar30,auVar20,auVar32);
      uVar1 = *(undefined4 *)(uVar5 + 0x90 + uVar6 * 4);
      auVar33._4_4_ = uVar1;
      auVar33._0_4_ = uVar1;
      auVar33._8_4_ = uVar1;
      auVar33._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar5 + 0x30 + uVar6 * 4);
      auVar37._4_4_ = uVar1;
      auVar37._0_4_ = uVar1;
      auVar37._8_4_ = uVar1;
      auVar37._12_4_ = uVar1;
      auVar26 = vfmadd231ps_fma(auVar37,auVar20,auVar33);
      uVar1 = *(undefined4 *)(uVar5 + 0xb0 + uVar6 * 4);
      auVar34._4_4_ = uVar1;
      auVar34._0_4_ = uVar1;
      auVar34._8_4_ = uVar1;
      auVar34._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar5 + 0x50 + uVar6 * 4);
      auVar38._4_4_ = uVar1;
      auVar38._0_4_ = uVar1;
      auVar38._8_4_ = uVar1;
      auVar38._12_4_ = uVar1;
      auVar24 = vfmadd231ps_fma(auVar38,auVar20,auVar34);
      uVar1 = *(undefined4 *)(uVar5 + 0xd0 + uVar6 * 4);
      auVar35._4_4_ = uVar1;
      auVar35._0_4_ = uVar1;
      auVar35._8_4_ = uVar1;
      auVar35._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar5 + 0x70 + uVar6 * 4);
      auVar39._4_4_ = uVar1;
      auVar39._0_4_ = uVar1;
      auVar39._8_4_ = uVar1;
      auVar39._12_4_ = uVar1;
      auVar28 = vfmadd231ps_fma(auVar39,auVar20,auVar35);
      auVar4._4_4_ = fStack_1714;
      auVar4._0_4_ = local_1718;
      auVar4._8_4_ = fStack_1710;
      auVar4._12_4_ = fStack_170c;
      auVar22 = vfmadd213ps_fma(auVar15,local_1768,auVar4);
      auVar19 = vfmadd213ps_fma(auVar18,local_1708,local_1728);
      auVar3._4_4_ = fStack_1734;
      auVar3._0_4_ = local_1738;
      auVar3._8_4_ = fStack_1730;
      auVar3._12_4_ = fStack_172c;
      auVar25 = vfmadd213ps_fma(auVar25,local_1778,auVar3);
      auVar26 = vfmadd213ps_fma(auVar26,local_1768,auVar4);
      auVar24 = vfmadd213ps_fma(auVar24,local_1708,local_1728);
      auVar28 = vfmadd213ps_fma(auVar28,local_1778,auVar3);
      auVar15 = vpminsd_avx(auVar22,auVar26);
      auVar18 = vpminsd_avx(auVar19,auVar24);
      auVar15 = vpmaxsd_avx(auVar15,auVar18);
      auVar18 = vpminsd_avx(auVar25,auVar28);
      auVar15 = vpmaxsd_avx(auVar15,auVar18);
      auVar18 = vpmaxsd_avx(auVar22,auVar26);
      auVar22 = vpmaxsd_avx(auVar19,auVar24);
      auVar22 = vpminsd_avx(auVar18,auVar22);
      auVar18 = vpmaxsd_avx(auVar25,auVar28);
      auVar18 = vpminsd_avx(auVar18,local_1788);
      auVar22 = vpminsd_avx(auVar22,auVar18);
      auVar18 = vpmaxsd_avx(auVar15,(undefined1  [16])local_16f8);
      if ((uVar9 & 7) == 6) {
        auVar18 = vcmpps_avx(auVar18,auVar22,2);
        uVar1 = *(undefined4 *)(uVar5 + 0xe0 + uVar6 * 4);
        auVar27._4_4_ = uVar1;
        auVar27._0_4_ = uVar1;
        auVar27._8_4_ = uVar1;
        auVar27._12_4_ = uVar1;
        auVar22 = vcmpps_avx(auVar27,auVar20,2);
        uVar1 = *(undefined4 *)(uVar5 + 0xf0 + uVar6 * 4);
        auVar31._4_4_ = uVar1;
        auVar31._0_4_ = uVar1;
        auVar31._8_4_ = uVar1;
        auVar31._12_4_ = uVar1;
        auVar20 = vcmpps_avx(auVar20,auVar31,1);
        auVar20 = vandps_avx(auVar22,auVar20);
        auVar20 = vandps_avx(auVar20,auVar18);
      }
      else {
        auVar20 = vcmpps_avx(auVar18,auVar22,2);
      }
      auVar18 = vcmpps_avx(local_1788,(undefined1  [16])aVar17,6);
      auVar20 = vandps_avx(auVar20,auVar18);
      auVar20 = vpslld_avx(auVar20,0x1f);
      auVar21 = ZEXT1664(auVar20);
      if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar20[0xf] < '\0'
         ) {
        auVar23._8_4_ = 0x7f800000;
        auVar23._0_8_ = 0x7f8000007f800000;
        auVar23._12_4_ = 0x7f800000;
        auVar20 = vblendvps_avx(auVar23,auVar15,auVar20);
        auVar21 = ZEXT1664(auVar20);
        if (sVar10 != 8) {
          pNVar11->ptr = sVar10;
          pNVar11 = pNVar11 + 1;
          *paVar8 = auVar16._0_16_;
          paVar8 = paVar8 + 1;
        }
        auVar16 = ZEXT1664(auVar20);
        sVar10 = sVar2;
      }
    }
  } while ((sVar2 != 8) && (bVar12 = uVar6 < 3, uVar6 = uVar6 + 1, bVar12));
  aVar17 = auVar16._0_16_;
  if (sVar10 == 8) goto LAB_00551fcc;
  goto LAB_00551de8;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }